

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_table_filter.cpp
# Opt level: O3

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::TableFilter::Deserialize(TableFilter *this,Deserializer *deserializer)

{
  TableFilterType TVar1;
  uint uVar2;
  SerializationException *this_00;
  pointer *__ptr;
  string str;
  _Alloc_hider local_48;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"filter_type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&stack0xffffffffffffffb8,deserializer);
    TVar1 = EnumUtil::FromString<duckdb::TableFilterType>(local_48._M_p);
    uVar2 = (uint)TVar1;
    if (local_48._M_p != &stack0xffffffffffffffc8) {
      operator_delete(local_48._M_p);
    }
  }
  else {
    uVar2 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  switch(uVar2 & 0xff) {
  case 0:
    ConstantFilter::Deserialize((ConstantFilter *)&stack0xffffffffffffffb8,deserializer);
    break;
  case 1:
    IsNullFilter::Deserialize((Deserializer *)&stack0xffffffffffffffb8);
    break;
  case 2:
    IsNotNullFilter::Deserialize((Deserializer *)&stack0xffffffffffffffb8);
    break;
  case 3:
    ConjunctionOrFilter::Deserialize((ConjunctionOrFilter *)&stack0xffffffffffffffb8,deserializer);
    break;
  case 4:
    ConjunctionAndFilter::Deserialize((ConjunctionAndFilter *)&stack0xffffffffffffffb8,deserializer)
    ;
    break;
  case 5:
    StructFilter::Deserialize((StructFilter *)&stack0xffffffffffffffb8,deserializer);
    break;
  case 6:
    OptionalFilter::Deserialize((OptionalFilter *)&stack0xffffffffffffffb8,deserializer);
    break;
  case 7:
    InFilter::Deserialize((InFilter *)&stack0xffffffffffffffb8,deserializer);
    break;
  case 8:
    DynamicFilter::Deserialize((Deserializer *)&stack0xffffffffffffffb8);
    break;
  case 9:
    ExpressionFilter::Deserialize((ExpressionFilter *)&stack0xffffffffffffffb8,deserializer);
    break;
  default:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    local_48._M_p = &stack0xffffffffffffffc8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffffb8,
               "Unsupported type for deserialization of TableFilter!","");
    SerializationException::SerializationException(this_00,(string *)&stack0xffffffffffffffb8);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this->_vptr_TableFilter = (_func_int **)local_48._M_p;
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

unique_ptr<TableFilter> TableFilter::Deserialize(Deserializer &deserializer) {
	auto filter_type = deserializer.ReadProperty<TableFilterType>(100, "filter_type");
	unique_ptr<TableFilter> result;
	switch (filter_type) {
	case TableFilterType::CONJUNCTION_AND:
		result = ConjunctionAndFilter::Deserialize(deserializer);
		break;
	case TableFilterType::CONJUNCTION_OR:
		result = ConjunctionOrFilter::Deserialize(deserializer);
		break;
	case TableFilterType::CONSTANT_COMPARISON:
		result = ConstantFilter::Deserialize(deserializer);
		break;
	case TableFilterType::DYNAMIC_FILTER:
		result = DynamicFilter::Deserialize(deserializer);
		break;
	case TableFilterType::EXPRESSION_FILTER:
		result = ExpressionFilter::Deserialize(deserializer);
		break;
	case TableFilterType::IN_FILTER:
		result = InFilter::Deserialize(deserializer);
		break;
	case TableFilterType::IS_NOT_NULL:
		result = IsNotNullFilter::Deserialize(deserializer);
		break;
	case TableFilterType::IS_NULL:
		result = IsNullFilter::Deserialize(deserializer);
		break;
	case TableFilterType::OPTIONAL_FILTER:
		result = OptionalFilter::Deserialize(deserializer);
		break;
	case TableFilterType::STRUCT_EXTRACT:
		result = StructFilter::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of TableFilter!");
	}
	return result;
}